

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffixtree.cpp
# Opt level: O0

void __thiscall
SuffixTree::GeneralizedSuffixTree::ProcessLCAQueries(GeneralizedSuffixTree *this,Node *node)

{
  uint uVar1;
  bool bVar2;
  reference ppVar3;
  reference ppNVar4;
  Node *pNVar5;
  uint string_num;
  pair<const_unsigned_int,_SuffixTree::Edge> *edge_pair_1;
  iterator __end1_1;
  iterator __begin1_1;
  unordered_map<unsigned_int,_SuffixTree::Edge,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SuffixTree::Edge>_>_>
  *__range1_1;
  Node *leader;
  pair<const_unsigned_int,_SuffixTree::Edge> *edge_pair;
  iterator __end1;
  iterator __begin1;
  unordered_map<unsigned_int,_SuffixTree::Edge,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SuffixTree::Edge>_>_>
  *__range1;
  Node *node_local;
  GeneralizedSuffixTree *this_local;
  
  __end1 = std::
           unordered_map<unsigned_int,_SuffixTree::Edge,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SuffixTree::Edge>_>_>
           ::begin(&node->edges);
  edge_pair = (pair<const_unsigned_int,_SuffixTree::Edge> *)
              std::
              unordered_map<unsigned_int,_SuffixTree::Edge,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SuffixTree::Edge>_>_>
              ::end(&node->edges);
  while( true ) {
    bVar2 = std::__detail::operator!=
                      (&__end1.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_SuffixTree::Edge>,_false>
                       ,(_Node_iterator_base<std::pair<const_unsigned_int,_SuffixTree::Edge>,_false>
                         *)&edge_pair);
    if (!bVar2) break;
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_int,_SuffixTree::Edge>,_false,_false>::
             operator*(&__end1);
    if ((ppVar3->second).length != 0) {
      ProcessLCAQueries(this,(ppVar3->second).field_0.node);
      pNVar5 = DSUUnite(this,node,(ppVar3->second).field_0.node);
      pNVar5->lca_class = node;
    }
    std::__detail::_Node_iterator<std::pair<const_unsigned_int,_SuffixTree::Edge>,_false,_false>::
    operator++(&__end1);
  }
  __end1_1 = std::
             unordered_map<unsigned_int,_SuffixTree::Edge,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SuffixTree::Edge>_>_>
             ::begin(&node->edges);
  edge_pair_1 = (pair<const_unsigned_int,_SuffixTree::Edge> *)
                std::
                unordered_map<unsigned_int,_SuffixTree::Edge,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SuffixTree::Edge>_>_>
                ::end(&node->edges);
  while( true ) {
    bVar2 = std::__detail::operator!=
                      (&__end1_1.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_SuffixTree::Edge>,_false>
                       ,(_Node_iterator_base<std::pair<const_unsigned_int,_SuffixTree::Edge>,_false>
                         *)&edge_pair_1);
    if (!bVar2) break;
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_int,_SuffixTree::Edge>,_false,_false>::
             operator*(&__end1_1);
    if ((ppVar3->second).length == 0) {
      uVar1 = ((ppVar3->second).field_0.leaf)->string_number;
      ppNVar4 = std::vector<SuffixTree::Node_*,_std::allocator<SuffixTree::Node_*>_>::operator[]
                          (&this->previous_suffixes,(ulong)uVar1);
      if (*ppNVar4 != (value_type)0x0) {
        ppNVar4 = std::vector<SuffixTree::Node_*,_std::allocator<SuffixTree::Node_*>_>::operator[]
                            (&this->previous_suffixes,(ulong)uVar1);
        pNVar5 = DSUFind(this,*ppNVar4);
        pNVar5->lca_class->num_lca = pNVar5->lca_class->num_lca + 1;
      }
      ppNVar4 = std::vector<SuffixTree::Node_*,_std::allocator<SuffixTree::Node_*>_>::operator[]
                          (&this->previous_suffixes,(ulong)uVar1);
      *ppNVar4 = node;
    }
    std::__detail::_Node_iterator<std::pair<const_unsigned_int,_SuffixTree::Edge>,_false,_false>::
    operator++(&__end1_1);
  }
  return;
}

Assistant:

void GeneralizedSuffixTree::ProcessLCAQueries (Node *node)
{
    for (const auto &edge_pair : node->edges)
        if (edge_pair.second.length)
        {
            ProcessLCAQueries (edge_pair.second.node);
            Node *leader = DSUUnite (node, edge_pair.second.node);
            leader->lca_class = node;
        }
    for (const auto &edge_pair : node->edges)
        if (!edge_pair.second.length)
        {
            uint string_num = edge_pair.second.leaf->string_number;
            if (previous_suffixes[string_num])
                ++ (DSUFind (previous_suffixes[string_num])->lca_class->num_lca);
            previous_suffixes[string_num] = node;
        }
}